

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O3

char * TiXmlBase::ReadName(char *p,TiXmlString *name,TiXmlEncoding encoding)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  
  TiXmlString::assign(name,"",0);
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxmlparser.cpp"
                  ,0x197,
                  "static const char *TiXmlBase::ReadName(const char *, TiXmlString *, TiXmlEncoding)"
                 );
  }
  bVar1 = *p;
  if ((bVar1 == 0) ||
     (((pcVar3 = p, bVar1 < 0x7f && (iVar2 = isalpha((uint)bVar1), bVar1 != 0x5f)) && (iVar2 == 0)))
     ) {
    pcVar3 = (char *)0x0;
  }
  else {
    do {
      if (bVar1 < 0x7f) {
        iVar2 = isalnum((uint)bVar1);
        if ((iVar2 == 0) &&
           ((0x32 < bVar1 - 0x2d || ((0x4000000002003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) == 0))
           )) break;
      }
      bVar1 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (bVar1 != 0);
    if (0 < (long)pcVar3 - (long)p) {
      TiXmlString::assign(name,p,(long)pcVar3 - (long)p);
    }
  }
  return pcVar3;
}

Assistant:

const char* TiXmlBase::ReadName( const char* p, TIXML_STRING * name, TiXmlEncoding encoding )
{
	// Oddly, not supported on some comilers,
	//name->clear();
	// So use this:
	*name = "";
	assert( p );

	// Names start with letters or underscores.
	// Of course, in unicode, tinyxml has no idea what a letter *is*. The
	// algorithm is generous.
	//
	// After that, they can be letters, underscores, numbers,
	// hyphens, or colons. (Colons are valid ony for namespaces,
	// but tinyxml can't tell namespaces from names.)
	if (    p && *p 
		 && ( IsAlpha( (unsigned char) *p, encoding ) || *p == '_' ) )
	{
		const char* start = p;
		while(		p && *p
				&&	(		IsAlphaNum( (unsigned char ) *p, encoding ) 
						 || *p == '_'
						 || *p == '-'
						 || *p == '.'
						 || *p == ':' ) )
		{
			//(*name) += *p; // expensive
			++p;
		}
		if ( p-start > 0 ) {
			name->assign( start, p-start );
		}
		return p;
	}
	return 0;
}